

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O1

void prng_add_entropy(prng *pr,uint source_id,ptrlen data)

{
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var1;
  long *plVar2;
  ulong uVar3;
  uint uVar4;
  uint64_t uVar5;
  uint uVar6;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var7;
  long lVar8;
  ulong uVar9;
  uchar buf [114];
  undefined1 auStack_a8 [128];
  
  if (0x10 < source_id) {
    __assert_fail("source_id < NOISE_MAX_SOURCES",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/prng.c",
                  0xf4,"void prng_add_entropy(prng *, unsigned int, ptrlen)");
  }
  uVar4 = *(int *)((long)&pr[2].binarysink_[0].write + (ulong)source_id * 4) + 1;
  *(uint *)((long)&pr[2].binarysink_[0].write + (ulong)source_id * 4) = uVar4;
  uVar3 = 0;
  do {
    uVar9 = uVar3;
    if (0x1e < uVar9) break;
    uVar6 = uVar4 & 1;
    uVar4 = uVar4 >> 1;
    uVar3 = uVar9 + 1;
  } while (uVar6 == 0);
  BinarySink_put_datapl(*(BinarySink **)((&pr[4].binarysink_[0].writefmtv)[uVar9] + 8),data);
  if (uVar9 + 1 == 1) {
    p_Var1 = pr[0xc].binarysink_[0].writefmtv;
    p_Var7 = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0;
    if ((_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)data.len <= p_Var1) {
      p_Var7 = p_Var1 + -(long)data.len;
    }
    pr[0xc].binarysink_[0].writefmtv = p_Var7;
  }
  if (pr[0xc].binarysink_[0].writefmtv ==
      (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0) {
    uVar5 = prng_reseed_time_ms();
    if (99 < uVar5 - pr[0xd].savesize) {
      prng_seed_begin(pr);
      uVar4 = *(int *)&pr[0xc].binarysink_[0].binarysink_ + 1;
      *(uint *)&pr[0xc].binarysink_[0].binarysink_ = uVar4;
      lVar8 = 0x12;
      do {
        plVar2 = *(long **)((long)pr->binarysink_ + lVar8 * 8 + -8);
        (**(code **)(*plVar2 + 0x18))(plVar2,auStack_a8);
        BinarySink_put_data(pr->binarysink_,auStack_a8,*(size_t *)(pr[1].savesize + 0x28));
        (**(code **)(**(long **)((long)pr->binarysink_ + lVar8 * 8 + -8) + 8))();
        if ((uVar4 & 1) != 0) break;
        uVar4 = uVar4 >> 1;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x32);
      smemclr(auStack_a8,0x72);
      prng_seed_finish(pr);
    }
  }
  return;
}

Assistant:

void prng_add_entropy(prng *pr, unsigned source_id, ptrlen data)
{
    prng_impl *pi = container_of(pr, prng_impl, Prng);

    assert(source_id < NOISE_MAX_SOURCES);
    uint32_t counter = ++pi->source_counters[source_id];

    size_t index = 0;
    while (index+1 < NCOLLECTORS && !(counter & 1)) {
        counter >>= 1;
        index++;
    }

    prngdebug("prng_add_entropy source=%u size=%"SIZEu" -> collector %zi\n",
              source_id, data.len, index);

    put_datapl(pi->collectors[index], data);

    if (index == 0)
        pi->until_reseed = (pi->until_reseed < data.len ? 0 :
                            pi->until_reseed - data.len);

    if (pi->until_reseed == 0 &&
        prng_reseed_time_ms() - pi->last_reseed_time >= 100) {
        prng_seed_begin(&pi->Prng);

        unsigned char buf[MAX_HASH_LEN];
        uint32_t reseed_index = ++pi->reseeds;
        prngdebug("prng entropy reseed #%"PRIu32"\n", reseed_index);
        for (size_t i = 0; i < NCOLLECTORS; i++) {
            prngdebug("emptying collector %"SIZEu"\n", i);
            ssh_hash_digest(pi->collectors[i], buf);
            put_data(&pi->Prng, buf, pi->hashalg->hlen);
            ssh_hash_reset(pi->collectors[i]);
            if (reseed_index & 1)
                break;
            reseed_index >>= 1;
        }
        smemclr(buf, sizeof(buf));
        prng_seed_finish(&pi->Prng);
    }
}